

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# channel.c
# Opt level: O0

int channel_set_in(uint32_t field,uint32_t location,void *buffer,mixed_segment *segment)

{
  channel_data *data;
  mixed_segment *segment_local;
  void *buffer_local;
  uint32_t location_local;
  uint32_t field_local;
  
  if (field == 0) {
    if (location < *(byte *)((long)segment->data + 0xe0)) {
      *(void **)((long)segment->data + (ulong)location * 8) = buffer;
      location_local = 1;
    }
    else {
      mixed_err(6);
      location_local = 0;
    }
  }
  else {
    mixed_err(7);
    location_local = 0;
  }
  return location_local;
}

Assistant:

int channel_set_in(uint32_t field, uint32_t location, void *buffer, struct mixed_segment *segment){
  struct channel_data *data = (struct channel_data *)segment->data;

  switch(field){
  case MIXED_BUFFER:
    if(data->in_channels <= location){
      mixed_err(MIXED_INVALID_LOCATION);
      return 0;
    }
    data->in[location] = (struct mixed_buffer *)buffer;
    return 1;
  default:
    mixed_err(MIXED_INVALID_FIELD);
    return 0;
  }
}